

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplace_back<slang::ast::DefinitionSymbol::ParameterDecl_const&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,ParameterDecl *args)

{
  size_t *psVar1;
  SourceLocation *pSVar2;
  ulong uVar3;
  anon_union_8_3_62382250_for_ParameterDecl_0 *p;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar4;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar5;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar8;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar9;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar10;
  size_t sVar11;
  char *pcVar12;
  SourceLocation SVar13;
  SourceLocation SVar14;
  size_t sVar15;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar16;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar17;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar18;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar19;
  long lVar20;
  long lVar21;
  anon_union_8_3_62382250_for_ParameterDecl_0 *__src;
  size_type sVar22;
  ulong uVar23;
  
  __src = &this->data_[this->len].field_0;
  if (this->len != this->cap) {
    aVar4 = args->field_0;
    aVar5 = args->field_1;
    aVar6 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->name)._M_len;
    aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->name)._M_str;
    aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&args->location;
    aVar9 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->attributes)._M_ptr;
    aVar10 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&args->isTypeParam;
    __src[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
               (args->attributes)._M_extent._M_extent_value;
    __src[7] = aVar10;
    __src[4] = aVar8;
    __src[5] = aVar9;
    __src[2] = aVar6;
    __src[3] = aVar7;
    *__src = aVar4;
    *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(__src + 1) = aVar5;
    sVar22 = this->len;
    this->len = sVar22 + 1;
    return this->data_ + sVar22;
  }
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar23 = this->len + 1;
  uVar3 = this->cap;
  if (uVar23 < uVar3 * 2) {
    uVar23 = uVar3 * 2;
  }
  if (0x1ffffffffffffff - uVar3 < uVar3) {
    uVar23 = 0x1ffffffffffffff;
  }
  lVar21 = (long)__src - (long)this->data_;
  paVar17 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar23 << 6);
  aVar4 = args->field_0;
  aVar5 = args->field_1;
  sVar11 = (args->name)._M_len;
  pcVar12 = (args->name)._M_str;
  SVar13 = args->location;
  SVar14 = (SourceLocation)(args->attributes)._M_ptr;
  sVar15 = *(size_t *)&args->isTypeParam;
  psVar1 = (size_t *)((long)paVar17 + lVar21 + 0x30);
  *psVar1 = (args->attributes)._M_extent._M_extent_value;
  psVar1[1] = sVar15;
  pSVar2 = (SourceLocation *)((long)paVar17 + lVar21 + 0x20);
  *pSVar2 = SVar13;
  pSVar2[1] = SVar14;
  psVar1 = (size_t *)((long)paVar17 + lVar21 + 0x10);
  *psVar1 = sVar11;
  psVar1[1] = (size_t)pcVar12;
  *(anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar17 + lVar21) = aVar4;
  *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)
   ((anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar17 + lVar21) + 1) = aVar5;
  p = &this->data_->field_0;
  sVar22 = this->len;
  lVar20 = (long)p + (sVar22 * 0x40 - (long)__src);
  paVar18 = p;
  paVar19 = paVar17;
  if (lVar20 == 0) {
    paVar18 = paVar17;
    paVar19 = p;
    if (sVar22 != 0) {
      do {
        aVar4 = *paVar19;
        aVar6 = paVar19[1];
        aVar7 = paVar19[2];
        aVar8 = paVar19[3];
        aVar9 = paVar19[4];
        aVar10 = paVar19[5];
        aVar16 = paVar19[7];
        paVar18[6] = paVar19[6];
        paVar18[7] = aVar16;
        paVar18[4] = aVar9;
        paVar18[5] = aVar10;
        paVar18[2] = aVar7;
        paVar18[3] = aVar8;
        *paVar18 = aVar4;
        paVar18[1] = aVar6;
        paVar19 = paVar19 + 8;
        paVar18 = paVar18 + 8;
      } while (paVar19 != __src);
    }
  }
  else {
    for (; paVar18 != __src; paVar18 = paVar18 + 8) {
      aVar4 = *paVar18;
      aVar6 = paVar18[1];
      aVar7 = paVar18[2];
      aVar8 = paVar18[3];
      aVar9 = paVar18[4];
      aVar10 = paVar18[5];
      aVar16 = paVar18[7];
      paVar19[6] = paVar18[6];
      paVar19[7] = aVar16;
      paVar19[4] = aVar9;
      paVar19[5] = aVar10;
      paVar19[2] = aVar7;
      paVar19[3] = aVar8;
      *paVar19 = aVar4;
      paVar19[1] = aVar6;
      paVar19 = paVar19 + 8;
    }
    memcpy((void *)((long)paVar17 + lVar21 + 0x40),__src,
           (lVar20 - 0x40U & 0xffffffffffffffc0) + 0x40);
  }
  if (p != (anon_union_8_3_62382250_for_ParameterDecl_0 *)this->firstElement) {
    operator_delete(p);
    sVar22 = this->len;
  }
  this->len = sVar22 + 1;
  this->cap = uVar23;
  this->data_ = (pointer)paVar17;
  return (reference)((long)paVar17 + lVar21);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }